

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPrivate::updateLayout(QWizardPrivate *this)

{
  long lVar1;
  QWizard *this_00;
  QVBoxLayout *pQVar2;
  QWizardHeader *this_01;
  QLabel *pQVar3;
  bool bVar4;
  undefined4 uVar5;
  QWidget *this_02;
  QLayout *pQVar6;
  long *plVar7;
  ulong uVar8;
  QSpacerItem *this_03;
  Policy vPolicy;
  WizardPixmap which;
  long in_FS_OFFSET;
  QPixmap local_e0 [24];
  QPixmap local_c8 [24];
  undefined1 local_b0 [24];
  QArrayDataPointer<char16_t> local_98;
  QWizardLayoutInfo info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizard **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  disableUpdates(this);
  info._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  info._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  layoutInfoForCurrentPage(&info,this);
  bVar4 = QWizardLayoutInfo::operator!=(&this->layoutInfo,&info);
  if (bVar4) {
    recreateLayout(this,&info);
  }
  this_02 = &QWizard::currentPage(this_00)->super_QWidget;
  if (this_02 != (QWidget *)0x0) {
    pQVar6 = QWidget::layout(this_02);
    if (pQVar6 == (QLayout *)0x0) {
      vPolicy = Ignored;
    }
    else {
      pQVar2 = this->pageVBoxLayout;
      uVar5 = (**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xb8))
                        (pQVar2,this_02);
      plVar7 = (long *)(**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xa8))
                                 (pQVar2,uVar5);
      uVar8 = (**(code **)(*plVar7 + 0x28))(plVar7);
      vPolicy = Ignored;
      if ((uVar8 & 2) == 0) {
        vPolicy = MinimumExpanding;
      }
    }
    pQVar2 = this->pageVBoxLayout;
    (**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 200))(pQVar2);
    plVar7 = (long *)(**(code **)(*(long *)&(pQVar2->super_QBoxLayout).super_QLayout + 0xa8))
                               (pQVar2);
    this_03 = (QSpacerItem *)(**(code **)(*plVar7 + 0x78))(plVar7);
    QSpacerItem::changeSize(this_03,0,0,Ignored,vPolicy);
    (**(code **)(*(long *)&(this->pageVBoxLayout->super_QBoxLayout).super_QLayout + 0x70))();
  }
  which = (WizardPixmap)this_02;
  if (info.header == true) {
    this_01 = this->headerWidget;
    QWizardPage::title((QString *)&local_98,(QWizardPage *)this_02);
    QWizardPage::subTitle((QString *)local_b0,(QWizardPage *)this_02);
    QWizardPage::pixmap((QWizardPage *)local_c8,which);
    QWizardPage::pixmap((QWizardPage *)local_e0,which);
    QWizardHeader::setup
              (this_01,&info,(QString *)&local_98,(QString *)local_b0,local_c8,local_e0,
               this->titleFmt,this->subTitleFmt);
    QPixmap::~QPixmap(local_e0);
    QPixmap::~QPixmap(local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  if ((info.watermark != false) || (info.sideWidget == true)) {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_98);
    if (info.watermark == true) {
      if (this_02 == (QWidget *)0x0) {
        QPixmap::QPixmap((QPixmap *)local_b0,
                         (QPixmap *)
                         (*(long *)&(this_00->super_QDialog).super_QWidget.field_0x8 + 0x3c0));
      }
      else {
        QWizardPage::pixmap((QWizardPage *)local_b0,which);
      }
      QPixmap::operator=((QPixmap *)&local_98,(QPixmap *)local_b0);
      QPixmap::~QPixmap((QPixmap *)local_b0);
    }
    QLabel::setPixmap(&this->watermarkLabel->super_QLabel,(QPixmap *)&local_98);
    QPixmap::~QPixmap((QPixmap *)&local_98);
  }
  if (info.title == true) {
    QLabel::setTextFormat(this->titleLabel,this->titleFmt);
    pQVar3 = this->titleLabel;
    QWizardPage::title((QString *)&local_98,(QWizardPage *)this_02);
    QLabel::setText(pQVar3,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  if (info.subTitle == true) {
    QLabel::setTextFormat(this->subTitleLabel,this->subTitleFmt);
    pQVar3 = this->subTitleLabel;
    QWizardPage::subTitle((QString *)&local_98,(QWizardPage *)this_02);
    QLabel::setText(pQVar3,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  enableUpdates(this);
  updateMinMaxSizes(this,&info);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::updateLayout()
{
    Q_Q(QWizard);

    disableUpdates();

    QWizardLayoutInfo info = layoutInfoForCurrentPage();
    if (layoutInfo != info)
        recreateLayout(info);
    QWizardPage *page = q->currentPage();

    // If the page can expand vertically, let it stretch "infinitely" more
    // than the QSpacerItem at the bottom. Otherwise, let the QSpacerItem
    // stretch "infinitely" more than the page. Change the bottom item's
    // policy accordingly. The case that the page has no layout is basically
    // for Designer, only.
    if (page) {
        bool expandPage = !page->layout();
        if (!expandPage) {
            const QLayoutItem *pageItem = pageVBoxLayout->itemAt(pageVBoxLayout->indexOf(page));
            expandPage = pageItem->expandingDirections() & Qt::Vertical;
        }
        QSpacerItem *bottomSpacer = pageVBoxLayout->itemAt(pageVBoxLayout->count() -  1)->spacerItem();
        Q_ASSERT(bottomSpacer);
        bottomSpacer->changeSize(0, 0, QSizePolicy::Ignored, expandPage ? QSizePolicy::Ignored : QSizePolicy::MinimumExpanding);
        pageVBoxLayout->invalidate();
    }

    if (info.header) {
        Q_ASSERT(page);
        headerWidget->setup(info, page->title(), page->subTitle(),
                            page->pixmap(QWizard::LogoPixmap), page->pixmap(QWizard::BannerPixmap),
                            titleFmt, subTitleFmt);
    }

    if (info.watermark || info.sideWidget) {
        QPixmap pix;
        if (info.watermark) {
            if (page)
                pix = page->pixmap(QWizard::WatermarkPixmap);
            else
                pix = q->pixmap(QWizard::WatermarkPixmap);
        }
        watermarkLabel->setPixmap(pix); // in case there is no watermark and we show the side widget we need to clear the watermark
    }

    if (info.title) {
        Q_ASSERT(page);
        titleLabel->setTextFormat(titleFmt);
        titleLabel->setText(page->title());
    }
    if (info.subTitle) {
        Q_ASSERT(page);
        subTitleLabel->setTextFormat(subTitleFmt);
        subTitleLabel->setText(page->subTitle());
    }

    enableUpdates();
    updateMinMaxSizes(info);
}